

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_parse_url_path(connectdata *conn)

{
  SessionHandle *data_00;
  CURLcode CVar1;
  char *path;
  POP3 *pop3;
  SessionHandle *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  CVar1 = Curl_urldecode(data_00,(data_00->state).path,0,(char **)((long)(data_00->req).protop + 8),
                         (size_t *)0x0,true);
  return CVar1;
}

Assistant:

static CURLcode pop3_parse_url_path(struct connectdata *conn)
{
  /* The POP3 struct is already initialised in pop3_connect() */
  struct SessionHandle *data = conn->data;
  struct POP3 *pop3 = data->req.protop;
  const char *path = data->state.path;

  /* URL decode the path for the message ID */
  return Curl_urldecode(data, path, 0, &pop3->id, NULL, TRUE);
}